

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O2

double __thiscall booster::log::sinks::syslog::log(syslog *this,double __x)

{
  level_type lVar1;
  char *pcVar2;
  char *pcVar3;
  int __pri;
  message *in_RSI;
  double dVar4;
  string local_40;
  
  lVar1 = in_RSI->level_;
  __pri = 0;
  if (9 < (int)lVar1) {
    if (lVar1 < critical) {
      __pri = 1;
    }
    else if (lVar1 < error) {
      __pri = 2;
    }
    else if (lVar1 < warning) {
      __pri = 3;
    }
    else if (lVar1 < notice) {
      __pri = 4;
    }
    else if (lVar1 < info) {
      __pri = 5;
    }
    else {
      __pri = 7 - (uint)(lVar1 < debug);
    }
  }
  pcVar2 = in_RSI->module_;
  message::log_message_abi_cxx11_(&local_40,in_RSI);
  pcVar3 = message::file_name(in_RSI);
  ::syslog(__pri,"%s: %s (%s:%d)",pcVar2,local_40._M_dataplus._M_p,pcVar3,
           (ulong)(uint)in_RSI->file_line_);
  dVar4 = (double)std::__cxx11::string::~string((string *)&local_40);
  return dVar4;
}

Assistant:

void syslog::log(message const &msg)
		{
			int syslevel;
			level_type l=msg.level();
			if(/*emergency <= l &&*/ l < alert)
				syslevel = LOG_EMERG;
			else if(alert <= l && l < critical)
				syslevel = LOG_ALERT;
			else if(critical <= l && l < error)
				syslevel = LOG_CRIT;
			else if(error <= l && l < warning)
				syslevel=LOG_ERR;
			else if(warning <= l && l < notice)
				syslevel = LOG_WARNING;
			else if(notice <= l && l< info)
				syslevel = LOG_NOTICE;
			else if(info <= l && l<debug)
				syslevel = LOG_INFO;
			else /*if(debug <= l)*/
				syslevel = LOG_DEBUG;
			::syslog(syslevel,"%s: %s (%s:%d)",msg.module(),msg.log_message().c_str(),msg.file_name(),msg.file_line());
		}